

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O3

void dirIfInternal(char *dirName,aint val)

{
  uint uVar1;
  bool bVar2;
  EReturn EVar3;
  int iVar4;
  uint uVar5;
  char errorsTxt [2] [48];
  uint local_8c;
  char local_88 [48];
  char local_58 [48];
  
  uVar5 = 0;
  local_8c = val;
  snprintf(local_88,0x30,dirIfErrorsTxtSrc[0],dirName);
  snprintf(local_58,0x30,dirIfErrorsTxtSrc[1],dirName);
  ListFile(false);
  iVar4 = 0;
  while( true ) {
    while( true ) {
      uVar1 = local_8c;
      if (local_8c == 0) {
        EVar3 = SkipFile();
      }
      else {
        EVar3 = ReadFile();
      }
      uVar5 = uVar5 | uVar1;
      if (EVar3 != ELSEIF) break;
      bVar2 = local_8c == 0;
      local_8c = (uint)(bVar2 && uVar5 == 0);
      if (bVar2 && uVar5 == 0) {
        bVar2 = dirIfIfn((aint *)&local_8c);
        uVar5 = 0;
        if (!bVar2) {
          local_8c = 0;
          uVar5 = 1;
        }
      }
    }
    if (EVar3 == ENDIF) break;
    if (EVar3 != ELSE) {
      if (IsRunning == 0) {
        donotlist = 1;
      }
      else {
        Error(local_88,(char *)0x0,PASS3);
        donotlist = (int)(IsRunning == 0);
      }
      return;
    }
    if (iVar4 != 0) {
      Error(local_58,(char *)0x0,PASS3);
    }
    iVar4 = iVar4 + 1;
    local_8c = (uint)(local_8c == 0 && uVar5 == 0);
  }
  return;
}

Assistant:

static void dirIfInternal(const char* dirName, aint val) {
	// set up error messages for the particular pseudo-op
	char errorsTxt[dirIfErrorsN][dirIfErrorsSZ];
	for (size_t i = 0; i < dirIfErrorsN; ++i) {
		SPRINTF1(errorsTxt[i], dirIfErrorsSZ, dirIfErrorsTxtSrc[i], dirName);
	}
	// do the IF**some** part
	ListFile();
	EReturn ret = END;
	aint elseCounter = 0;
	aint orVal = false;
	while (ENDIF != ret) {
		orVal |= val;
		switch (ret = val ? ReadFile() : SkipFile()) {
			case ELSE:
				if (elseCounter++) Error(errorsTxt[1]);
				val = !val && !orVal;
				break;
			case ELSEIF:
				val = !val && !orVal;
				if (val) {		// active ELSEIF, evaluate expression
					if (!dirIfIfn(val)) {
						val = false;		// syntax error in expression
						orVal = true;		// force remaining IF-blocks inactive
					}
				}
				break;
			case ENDIF:
				break;
			default:
				if (IsRunning) Error(errorsTxt[0]);
				donotlist=!IsRunning;		// do the listing only if still running
				return;
		}
	}
}